

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> * __thiscall
NavierStokesBase::fetchBCArray
          (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *__return_storage_ptr__,
          NavierStokesBase *this,int State_Type,int scomp,int ncomp)

{
  pointer pBVar1;
  BCRec *pBVar2;
  undefined4 in_register_0000000c;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  allocator_type local_39;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000000c,scomp);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
            (&__return_storage_ptr__->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
             (long)ncomp,&local_39);
  uVar6 = 0;
  uVar5 = (ulong)(uint)ncomp;
  if (ncomp < 1) {
    uVar5 = uVar6;
  }
  lVar4 = 0xc;
  for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
    pBVar2 = amrex::StateDescriptor::getBC
                       ((this->super_AmrLevel).state.
                        super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                        super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                        _M_impl.super__Vector_impl_data._M_start[State_Type].desc,
                        (int)local_38 + (int)uVar6);
    pBVar1 = (__return_storage_ptr__->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar3 = -0xc; lVar3 != 0; lVar3 = lVar3 + 4) {
      *(undefined4 *)((long)pBVar1->bc + lVar3 + lVar4) =
           *(undefined4 *)((long)pBVar2->bc + lVar3 + 0xc);
      *(undefined4 *)((long)pBVar1->bc + lVar3 + lVar4 + 0xc) =
           *(undefined4 *)((long)pBVar2[1].bc + lVar3);
    }
    lVar4 = lVar4 + 0x18;
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<BCRec>
NavierStokesBase::fetchBCArray (int State_Type, int scomp, int ncomp)
{
    Vector<BCRec> bc(ncomp);
    const StateDescriptor* stDesc;
    const Box& domain = geom.Domain();

    for (int n(0); n < ncomp; ++n)
    {
      stDesc=state[State_Type].descriptor();
      setBC(domain,domain,stDesc->getBC(scomp+n), bc[n] );
    }

    return bc;
}